

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b4f9::verifyPixelsAreEqual<Imath_3_2::half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ushort *puVar8;
  ArgExc *this;
  int iVar9;
  int iVar10;
  
  lVar6 = __dynamic_cast(c1,&Imf_3_2::FlatImageChannel::typeinfo,
                         &Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
  if ((lVar6 == 0) ||
     (lVar7 = __dynamic_cast(c2,&Imf_3_2::FlatImageChannel::typeinfo,
                             &Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0),
     lVar7 == 0)) {
    __cxa_bad_cast();
  }
  lVar5 = *(long *)(c1 + 8);
  iVar3 = *(int *)(c1 + 0x10);
  iVar4 = *(int *)(c1 + 0x14);
  iVar10 = *(int *)(lVar5 + 0x1c);
  do {
    if (*(int *)(lVar5 + 0x24) < iVar10) {
      return;
    }
    iVar9 = *(int *)(lVar5 + 0x18);
    while (iVar9 <= *(int *)(lVar5 + 0x20)) {
      puVar8 = (ushort *)Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::at((int)lVar6,iVar9);
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*puVar8 * 4);
      puVar8 = (ushort *)Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::at((int)lVar7,dx + iVar9);
      iVar9 = iVar9 + iVar3;
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)*puVar8 * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
        __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    iVar10 = iVar10 + iVar4;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const FlatImageChannel& c1, const FlatImageChannel& c2, int dx, int dy)
{
    const TypedFlatImageChannel<T>& tc1 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T>& tc2 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c2);

    const Box2i& dataWindow = c1.level ().dataWindow ();
    int          xStep      = c1.xSampling ();
    int          yStep      = c1.ySampling ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}